

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

string * QuestSerialize_abi_cxx11_
                   (string *__return_storage_ptr__,
                   map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                   *list,set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
                         *list_inactive)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  Quest_Context *this;
  short sVar3;
  Quest *this_00;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int subject;
  ulong extraout_RDX;
  ulong uVar8;
  Character_QuestState state;
  undefined1 local_a8 [8];
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
  *local_40;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var4 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  local_40 = list_inactive;
  local_38 = list;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      this = (Quest_Context *)p_Var4[1]._M_parent;
      p_Var6 = p_Var4[1]._M_left;
      if (p_Var6 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
        }
      }
      if (this != (Quest_Context *)0x0) {
        this_00 = Quest_Context::GetQuest(this);
        sVar3 = Quest::ID(this_00);
        util::to_string_abi_cxx11_((string *)local_a8,(util *)(ulong)(uint)(int)sVar3,subject);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,CONCAT62(local_a8._2_6_,local_a8._0_2_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_a8._2_6_,local_a8._0_2_) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT62(local_a8._2_6_,local_a8._0_2_),
                          local_98._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        EOPlus::Context::StateName_abi_cxx11_((string *)local_a8,(Context *)this);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,CONCAT62(local_a8._2_6_,local_a8._0_2_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_a8._2_6_,local_a8._0_2_) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT62(local_a8._2_6_,local_a8._0_2_),
                          local_98._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        Quest_Context::SerializeProgress_abi_cxx11_((string *)local_a8,this);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,CONCAT62(local_a8._2_6_,local_a8._0_2_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_a8._2_6_,local_a8._0_2_) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT62(local_a8._2_6_,local_a8._0_2_),
                          local_98._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (p_Var6 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (local_40->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(local_40->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      local_a8._0_2_ = (undefined2)p_Var4[1]._M_color;
      local_a0 = local_98._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,p_Var4[1]._M_parent,
                 (long)&(p_Var4[1]._M_parent)->_M_color + (long)&(p_Var4[1]._M_left)->_M_color);
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,p_Var4[2]._M_parent,
                 (long)&(p_Var4[2]._M_parent)->_M_color + (long)&(p_Var4[2]._M_left)->_M_color);
      p_Var6 = (local_38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var1->_M_header;
      uVar8 = extraout_RDX;
      if (p_Var6 == (_Base_ptr)0x0) {
LAB_00112ba7:
        util::to_string_abi_cxx11_
                  (&local_60,(util *)(ulong)(uint)(int)(short)local_a8._0_2_,(int)uVar8);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80[0]);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        do {
          uVar2 = (undefined2)p_Var6[1]._M_color;
          uVar8 = (ulong)((short)uVar2 < (short)local_a8._0_2_);
          if ((short)local_a8._0_2_ <= (short)uVar2) {
            p_Var7 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[uVar8];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
           ((short)local_a8._0_2_ < (short)p_Var7[1]._M_color)) goto LAB_00112ba7;
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if (local_a0 != local_98._M_local_buf + 8) {
        operator_delete(local_a0,local_98._8_8_ + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QuestSerialize(const std::map<short, std::shared_ptr<Quest_Context>>& list, const std::set<Character_QuestState>& list_inactive)
{
	std::string serialized;

	UTIL_FOREACH(list, quest)
	{
		if (!quest.second)
			continue;

		serialized.append(util::to_string(quest.second->GetQuest()->ID()));
		serialized.append(",");
		serialized.append(quest.second->StateName());
		serialized.append(",");
		serialized.append(quest.second->SerializeProgress());
		serialized.append(";");
	}

	UTIL_FOREACH(list_inactive, state)
	{
		if (list.find(state.quest_id) != list.end())
		{
#ifdef DEBUG
			Console::Dbg("Discarding inactive quest save as the quest was restarted: %i", state.quest_id);
#endif // DEBUG
			continue;
		}

		serialized.append(util::to_string(state.quest_id));
		serialized.append(",");
		serialized.append(state.quest_state);
		serialized.append(",");
		serialized.append(state.quest_progress);
		serialized.append(";");
	}

	return serialized;
}